

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ext_trust_anchors_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  Span<const_unsigned_char> in;
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  size_t extraout_RDX;
  Span<const_unsigned_char> in_00;
  CBS child;
  
  bVar1 = true;
  if ((contents != (CBS *)0x0) && (uVar2 = ssl_protocol_version(hs->ssl), 0x303 < uVar2)) {
    iVar3 = CBS_get_u16_length_prefixed(contents,&child);
    if ((iVar3 != 0) &&
       (in_00.size_ = extraout_RDX, in_00.data_ = (uchar *)child.len,
       bVar1 = ssl_is_valid_trust_anchor_list((bssl *)child.data,in_00), bVar1)) {
      std::optional<bssl::Array<unsigned_char>_>::emplace<>(&hs->peer_requested_trust_anchors);
      in.size_ = child.len;
      in.data_ = child.data;
      bVar1 = Array<unsigned_char>::CopyFrom
                        ((Array<unsigned_char> *)&hs->peer_requested_trust_anchors,in);
      if (bVar1) {
        return true;
      }
      *out_alert = 'P';
      return false;
    }
    *out_alert = '2';
    bVar1 = false;
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0xa6e);
  }
  return bVar1;
}

Assistant:

static bool ext_trust_anchors_parse_clienthello(SSL_HANDSHAKE *hs,
                                                uint8_t *out_alert,
                                                CBS *contents) {
  if (contents == nullptr || ssl_protocol_version(hs->ssl) < TLS1_3_VERSION) {
    return true;
  }

  CBS child;
  if (!CBS_get_u16_length_prefixed(contents, &child) ||
      !ssl_is_valid_trust_anchor_list(child)) {
    *out_alert = SSL_AD_DECODE_ERROR;
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  hs->peer_requested_trust_anchors.emplace();
  if (!hs->peer_requested_trust_anchors->CopyFrom(child)) {
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }
  return true;
}